

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O0

ImageHeaders core::image::load_jpg_file_headers(string *filename)

{
  ImageHeaders IVar1;
  char *pcVar2;
  FILE *__stream;
  FileException *this;
  int *piVar3;
  Exception *pEVar4;
  allocator local_3b9;
  string local_3b8 [38];
  undefined1 local_392;
  allocator local_391;
  string local_390 [32];
  int local_370;
  int ret;
  code *local_360;
  jpeg_error_mgr jerr;
  jpeg_decompress_struct cinfo;
  FILE *fp;
  string *filename_local;
  ImageHeaders headers;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  __stream = fopen(pcVar2,"rb");
  if (__stream == (FILE *)0x0) {
    this = (FileException *)__cxa_allocate_exception(0x48);
    piVar3 = __errno_location();
    pcVar2 = strerror(*piVar3);
    util::FileException::FileException(this,filename,pcVar2);
    __cxa_throw(this,&util::FileException::typeinfo,util::FileException::~FileException);
  }
  jerr._160_8_ = jpeg_std_error(&local_360);
  local_360 = jpg_error_handler;
  jerr.error_exit = jpg_message_handler;
  jpeg_CreateDecompress(&jerr.first_addon_message,0x50,0x290);
  jpeg_stdio_src(&jerr.first_addon_message,__stream);
  local_370 = jpeg_read_header(&jerr.first_addon_message,0);
  if (local_370 != 1) {
    local_392 = 1;
    pEVar4 = (Exception *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_390,"JPEG header not recognized",&local_391);
    util::Exception::Exception(pEVar4,(string *)local_390);
    local_392 = 0;
    __cxa_throw(pEVar4,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  if ((cinfo.num_components != 1) && (cinfo.num_components != 2)) {
    pEVar4 = (Exception *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3b8,"Invalid JPEG color space",&local_3b9);
    util::Exception::Exception(pEVar4,(string *)local_3b8);
    __cxa_throw(pEVar4,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  jpeg_destroy_decompress(&jerr.first_addon_message);
  fclose(__stream);
  IVar1.height = cinfo.src._4_4_;
  IVar1.width = cinfo.src._0_4_;
  IVar1.channels = (cinfo.num_components == 2) + 1 + (uint)(cinfo.num_components == 2);
  IVar1.type = IMAGE_TYPE_UINT8;
  return IVar1;
}

Assistant:

ImageHeaders
load_jpg_file_headers (std::string const& filename)
{
    FILE* fp = std::fopen(filename.c_str(), "rb");
    if (fp == nullptr)
        throw util::FileException(filename, std::strerror(errno));

    jpeg_decompress_struct cinfo;
    jpeg_error_mgr jerr;
    ImageHeaders headers;
    try
    {
        /* Setup error handler and JPEG reader. */
        cinfo.err = jpeg_std_error(&jerr);
        jerr.error_exit = &jpg_error_handler;
        jerr.emit_message = &jpg_message_handler;
        jpeg_create_decompress(&cinfo);
        jpeg_stdio_src(&cinfo, fp);

        /* Read JPEG header. */
        int ret = jpeg_read_header(&cinfo, static_cast<boolean>(false));
        if (ret != JPEG_HEADER_OK)
            throw util::Exception("JPEG header not recognized");

        if (cinfo.out_color_space != JCS_GRAYSCALE
            && cinfo.out_color_space != JCS_RGB)
            throw util::Exception("Invalid JPEG color space");

        headers.width = cinfo.image_width;
        headers.height = cinfo.image_height;
        headers.channels = (cinfo.out_color_space == JCS_RGB ? 3 : 1);
        headers.type = IMAGE_TYPE_UINT8;

        jpeg_destroy_decompress(&cinfo);
        std::fclose(fp);
    }
    catch (...)
    {
        jpeg_destroy_decompress(&cinfo);
        std::fclose(fp);
        throw;
    }

    return headers;
}